

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O3

void use_bell(obj **optr)

{
  obj *obj;
  boolean bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  permonst *ptr;
  monst *mtmp;
  bool bVar5;
  bool bVar6;
  coord mm;
  coord local_2a;
  
  obj = *optr;
  if (obj->otyp == 0x10c) {
    bVar5 = obj->spe == '\0';
    bVar1 = invocation_pos(&u.uz,u.ux,u.uy);
    if (bVar1 == '\0') goto LAB_00147435;
    bVar1 = On_stairs(u.ux,u.uy);
    bVar6 = bVar1 == '\0';
  }
  else {
    bVar5 = true;
LAB_00147435:
    bVar6 = false;
  }
  pcVar4 = xname(obj);
  pcVar4 = the(pcVar4);
  pline("You ring %s.",pcVar4);
  if (((u._1052_1_ & 2) != 0) || ((u._1052_1_ & bVar5) != 0)) {
    pcVar4 = "But the sound is muffled.";
    goto LAB_00147479;
  }
  if ((bVar6 & bVar5) != 0) {
    pcVar4 = "But it makes no sound.";
    goto LAB_00147498;
  }
  if (bVar5 != false) {
    if (((((obj->field_0x4a & 1) != 0) && (uVar2 = mt_random(), (uVar2 & 3) == 0)) &&
        ((mvitals[0x44].mvflags & 3) == 0)) &&
       (((mvitals[0x45].mvflags & 3) == 0 && ((mvitals[0x46].mvflags & 3) == 0)))) {
      ptr = mkclass(&u.uz,'\x0e',0);
      mtmp = makemon(ptr,level,(int)u.ux,(int)u.uy,1);
      if (mtmp != (monst *)0x0) {
        pcVar4 = a_monnam(mtmp);
        pline("You summon %s!",pcVar4);
        bVar1 = obj_resists(obj,0x5d,100);
        if (bVar1 == '\0') {
          pcVar4 = Tobjnam(obj,"have");
          pline("%s shattered!",pcVar4);
          useup(obj);
          *optr = (obj *)0x0;
        }
        else {
          uVar2 = mt_random();
          if (uVar2 % 3 == 2) {
            nomovemsg = "";
            uVar2 = mt_random();
            nomul(~uVar2 | 0xfffffffe,(char *)0x0);
          }
          else if (uVar2 % 3 == 1) {
            mon_adjust_speed(mtmp,2,(obj *)0x0);
          }
        }
      }
    }
    goto LAB_00147661;
  }
  consume_obj_charge(obj,'\x01');
  uVar2 = *(uint *)&obj->field_0x4a;
  if ((u._1052_1_ & 1) != 0) {
    if ((uVar2 & 1) == 0) {
      openit();
      return;
    }
    goto LAB_001476b1;
  }
  if ((uVar2 & 1) != 0) {
    local_2a.x = u.ux;
    local_2a.y = u.uy;
    mkundead(level,&local_2a,'\0',1);
LAB_00147661:
    wake_nearby();
    return;
  }
  if (bVar6 != false) {
    pcVar4 = Tobjnam(obj,"issue");
    pline("%s an unsettling shrill sound...",pcVar4);
    obj->age = moves;
    discover_object(0x10c,'\x01','\x01');
    obj->field_0x4a = obj->field_0x4a | 0x10;
    goto LAB_00147661;
  }
  if ((uVar2 & 2) == 0) {
    iVar3 = findit();
    if (iVar3 != 0) goto LAB_0014749f;
LAB_001476b1:
    pcVar4 = "Nothing happens.";
LAB_00147479:
    pline(pcVar4);
    return;
  }
  bVar5 = uchain != (obj *)0x0;
  if (bVar5) {
    unpunish();
  }
  iVar3 = openit();
  iVar3 = iVar3 + (uint)bVar5;
  if (iVar3 == 1) {
    pcVar4 = "Something opens...";
  }
  else {
    if (iVar3 == 0) goto LAB_001476b1;
    pcVar4 = "Things open around you...";
  }
LAB_00147498:
  pline(pcVar4);
LAB_0014749f:
  discover_object(0x10c,'\x01','\x01');
  obj->field_0x4a = obj->field_0x4a | 0x10;
  return;
}

Assistant:

static void use_bell(struct obj **optr)
{
	struct obj *obj = *optr;
	struct monst *mtmp;
	boolean wakem = FALSE, learno = FALSE,
		ordinary = (obj->otyp != BELL_OF_OPENING || !obj->spe),
		invoking = (obj->otyp == BELL_OF_OPENING &&
			 invocation_pos(&u.uz, u.ux, u.uy) && !On_stairs(u.ux, u.uy));

	pline("You ring %s.", the(xname(obj)));

	if (Underwater || (u.uswallow && ordinary)) {
	    pline("But the sound is muffled.");

	} else if (invoking && ordinary) {
	    /* needs to be recharged... */
	    pline("But it makes no sound.");
	    learno = TRUE;	/* help player figure out why */

	} else if (ordinary) {
	    if (obj->cursed && !rn2(4) &&
		    /* note: once any of them are gone, we stop all of them */
		    !(mvitals[PM_WOOD_NYMPH].mvflags & G_GONE) &&
		    !(mvitals[PM_WATER_NYMPH].mvflags & G_GONE) &&
		    !(mvitals[PM_MOUNTAIN_NYMPH].mvflags & G_GONE) &&
		    (mtmp = makemon(mkclass(&u.uz, S_NYMPH, 0), level,
					u.ux, u.uy, NO_MINVENT)) != 0) {
		pline("You summon %s!", a_monnam(mtmp));
		if (!obj_resists(obj, 93, 100)) {
		    pline("%s shattered!", Tobjnam(obj, "have"));
		    useup(obj);
		    *optr = 0;
		} else switch (rn2(3)) {
			default:
				break;
			case 1:
				mon_adjust_speed(mtmp, 2, NULL);
				break;
			case 2: /* no explanation; it just happens... */
				nomovemsg = "";
				nomul(-rnd(2), NULL);
				break;
		}
	    }
	    wakem = TRUE;

	} else {
	    /* charged Bell of Opening */
	    consume_obj_charge(obj, TRUE);

	    if (u.uswallow) {
		if (!obj->cursed)
		    openit();
		else
		    pline("Nothing happens.");

	    } else if (obj->cursed) {
		coord mm;

		mm.x = u.ux;
		mm.y = u.uy;
		mkundead(level, &mm, FALSE, NO_MINVENT);
		wakem = TRUE;

	    } else  if (invoking) {
		pline("%s an unsettling shrill sound...",
		      Tobjnam(obj, "issue"));
		obj->age = moves;
		learno = TRUE;
		wakem = TRUE;

	    } else if (obj->blessed) {
		int res = 0;

		if (uchain) {
		    unpunish();
		    res = 1;
		}
		res += openit();
		switch (res) {
		  case 0:  pline("Nothing happens."); break;
		  case 1:  pline("Something opens...");
			   learno = TRUE; break;
		  default: pline("Things open around you...");
			   learno = TRUE; break;
		}

	    } else {  /* uncursed */
		if (findit() != 0) learno = TRUE;
		else pline("Nothing happens.");
	    }

	}	/* charged BofO */

	if (learno) {
	    makeknown(BELL_OF_OPENING);
	    obj->known = 1;
	}
	if (wakem) wake_nearby();
}